

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimistic_lock.hpp
# Opt level: O1

bool __thiscall unodb::optimistic_lock::check(optimistic_lock *this,version_type locked_version)

{
  version_tag_type vVar1;
  
  if (0 < (this->read_lock_count).super___atomic_base<long>._M_i) {
    vVar1 = (this->version).version.super___atomic_base<unsigned_long>._M_i;
    if (vVar1 != locked_version.version) {
      check();
    }
    return vVar1 == locked_version.version;
  }
  __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
}

Assistant:

[[nodiscard]] bool check(version_type locked_version) const noexcept {
    UNODB_DETAIL_ASSERT(read_lock_count.load(std::memory_order_acquire) > 0);

#ifndef UNODB_DETAIL_THREAD_SANITIZER
    std::atomic_thread_fence(std::memory_order_acquire);
#endif
    const auto result{locked_version == version.load_relaxed()};
#ifndef NDEBUG
    if (UNODB_DETAIL_UNLIKELY(!result)) dec_read_lock_count();
#endif
    return UNODB_DETAIL_LIKELY(result);
  }